

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O1

void __thiscall
btCompoundShape::calculateLocalInertia(btCompoundShape *this,btScalar mass,btVector3 *inertia)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  btVector3 aabbMax;
  btVector3 aabbMin;
  btTransform ident;
  undefined1 local_78 [8];
  float local_70;
  undefined1 local_68 [8];
  float local_60;
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  
  local_58 = 0x3f800000;
  local_54 = 0;
  uStack_4c = 0;
  local_44 = 0x3f800000;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0x3f800000;
  local_2c = 0;
  uStack_24 = 0;
  local_1c = 0;
  (*(this->super_btCollisionShape)._vptr_btCollisionShape[2])(this,&local_58,local_68,local_78);
  fVar1 = (local_70 - local_60) * 0.5;
  fVar1 = fVar1 + fVar1;
  fVar4 = mass / 12.0;
  fVar1 = fVar1 * fVar1;
  fVar2 = (local_78._0_4_ - local_68._0_4_) * 0.5;
  fVar3 = (local_78._4_4_ - local_68._4_4_) * 0.5;
  fVar2 = fVar2 + fVar2;
  fVar3 = fVar3 + fVar3;
  fVar3 = fVar3 * fVar3;
  *(ulong *)inertia->m_floats = CONCAT44((fVar2 * fVar2 + fVar1) * fVar4,(fVar3 + fVar1) * fVar4);
  inertia->m_floats[2] = (fVar2 * fVar2 + fVar3) * fVar4;
  return;
}

Assistant:

void	btCompoundShape::calculateLocalInertia(btScalar mass,btVector3& inertia) const
{
	//approximation: take the inertia from the aabb for now
	btTransform ident;
	ident.setIdentity();
	btVector3 aabbMin,aabbMax;
	getAabb(ident,aabbMin,aabbMax);

	btVector3 halfExtents = (aabbMax-aabbMin)*btScalar(0.5);

	btScalar lx=btScalar(2.)*(halfExtents.x());
	btScalar ly=btScalar(2.)*(halfExtents.y());
	btScalar lz=btScalar(2.)*(halfExtents.z());

	inertia[0] = mass/(btScalar(12.0)) * (ly*ly + lz*lz);
	inertia[1] = mass/(btScalar(12.0)) * (lx*lx + lz*lz);
	inertia[2] = mass/(btScalar(12.0)) * (lx*lx + ly*ly);

}